

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

int __thiscall
roaring::Roaring64Map::select
          (Roaring64Map *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  _Rb_tree_color _Var1;
  _Bool _Var2;
  _Rb_tree_node_base *in_RAX;
  _Rb_tree_node_base *p_Var3;
  runtime_error *this_00;
  _Rb_tree_node_base *p_Var4;
  undefined4 in_register_00000034;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  uint32_t low_bytes;
  bool local_45;
  uint32_t local_44;
  _Rb_tree_node_base *local_40;
  _Rb_tree_node_base *local_38;
  
  p_Var4 = (_Rb_tree_node_base *)CONCAT44(in_register_00000034,__nfds);
  p_Var6 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_45 = p_Var6 != local_38;
  local_40 = (_Rb_tree_node_base *)__readfds;
  if (local_45) {
    do {
      _Var1 = p_Var6[1]._M_color;
      p_Var3 = (_Rb_tree_node_base *)
               roaring_bitmap_get_cardinality((roaring_bitmap_t *)&p_Var6[1]._M_parent);
      in_RAX = p_Var3;
      p_Var5 = (_Rb_tree_node_base *)((long)p_Var4 - (long)p_Var3);
      if (p_Var4 < p_Var3) {
        _Var2 = roaring_bitmap_select
                          ((roaring_bitmap_t *)&p_Var6[1]._M_parent,(uint32_t)p_Var4,&local_44);
        if (!_Var2) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,
                     "Logic error: bitmap.select() returned false despite rank < cardinality()");
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        *(ulong *)local_40 = CONCAT44(_Var1,local_44);
        in_RAX = local_40;
        p_Var5 = p_Var4;
      }
      if (p_Var4 < p_Var3) break;
      in_RAX = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
      local_45 = in_RAX != local_38;
      p_Var4 = p_Var5;
      p_Var6 = in_RAX;
    } while (local_45);
  }
  return (int)CONCAT71((int7)((ulong)in_RAX >> 8),local_45);
}

Assistant:

bool select(uint64_t rank, uint64_t *element) const {
        for (const auto &map_entry : roarings) {
            auto key = map_entry.first;
            const auto &bitmap = map_entry.second;

            uint64_t sub_cardinality = bitmap.cardinality();
            if (rank < sub_cardinality) {
                uint32_t low_bytes;
                // Casting rank to uint32_t is safe because
                // rank < sub_cardinality and sub_cardinality <= 2^32.
                if (!bitmap.select((uint32_t)rank, &low_bytes)) {
                    ROARING_TERMINATE(
                        "Logic error: bitmap.select() "
                        "returned false despite rank < cardinality()");
                }
                *element = uniteBytes(key, low_bytes);
                return true;
            }
            rank -= sub_cardinality;
        }
        return false;
    }